

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.cpp
# Opt level: O0

void __thiscall mdsplit::mdsplitter::reindent_headers(mdsplitter *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  reference pmVar4;
  reference str;
  const_reference pvVar5;
  difference_type dVar6;
  value_type *pvVar7;
  ostream *poVar8;
  string_type local_138;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  int local_b0;
  short local_aa;
  int level_diff;
  short level;
  smatch sm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool inside_codeblock;
  mdsection *section;
  iterator __end1;
  iterator __begin1;
  vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_> *__range1;
  regex header_regex;
  mdsplitter *this_local;
  
  header_regex._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&__range1,"(#+) +(.*)",0x10);
  __end1 = std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::begin
                     (&this->sections_);
  section = (mdsection *)
            std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::end
                      (&this->sections_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
                                     *)&section), bVar1) {
    pmVar4 = __gnu_cxx::
             __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
             ::operator*(&__end1);
    bVar1 = false;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&pmVar4->lines);
    line = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&pmVar4->lines);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&line), bVar2) {
      str = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end2);
      bVar2 = is_codeblock(str);
      if (bVar2) {
        bVar1 = !bVar1;
      }
      if (!bVar1) {
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&level_diff);
        bVar2 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                          (str,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&level_diff,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&__range1,0);
        if (bVar2) {
          pvVar5 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)&level_diff,1);
          dVar6 = std::__cxx11::
                  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::length(pvVar5);
          local_aa = (short)dVar6;
          local_b0 = (int)local_aa - (int)pmVar4->level;
          if (local_b0 < 0) {
            pvVar7 = std::filesystem::__cxx11::path::c_str(&pmVar4->filepath);
            poVar8 = std::operator<<((ostream *)&std::cerr,pvVar7);
            poVar8 = std::operator<<(poVar8,": level_diff should not be less than zero.");
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            local_b0 = 0;
          }
          iVar3 = local_b0 + 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_110,(long)iVar3,'#',&local_111);
          std::operator+(&local_f0,&local_110," ");
          pvVar5 = std::__cxx11::
                   match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)&level_diff,2);
          std::__cxx11::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str(&local_138,pvVar5);
          std::operator+(&local_d0,&local_f0,&local_138);
          std::__cxx11::string::operator=((string *)str,(string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_138);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_110);
          std::allocator<char>::~allocator(&local_111);
        }
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&level_diff);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&__range1);
  return;
}

Assistant:

void mdsplitter::reindent_headers() {
        std::regex header_regex{"(#+) +(.*)"};
        for (auto &section : sections_) {
            bool inside_codeblock = false;
            for (auto &line : section.lines) {
                if (is_codeblock(line)) {
                    inside_codeblock = 1 - inside_codeblock;
                }

                if (inside_codeblock) {
                    continue;
                }

                std::smatch sm;
                if (std::regex_match(line, sm, header_regex)) {
                    auto level = static_cast<short>(sm[1].length());
                    auto level_diff = level - section.level;
                    if (level_diff < 0) {
                        std::cerr
                            << section.filepath.c_str()
                            << ": level_diff should not be less than zero."
                            << std::endl;
                        level_diff = 0;
                    }
                    line = std::string(level_diff + 1, '#') + " " + sm[2].str();
                }
            }
        }
    }